

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindow::setSystemMenu(QMdiSubWindow *this,QMenu *systemMenu)

{
  long lVar1;
  QMdiSubWindowPrivate *this_00;
  QWidget *pQVar2;
  long in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindowPrivate *d;
  QMenu *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb8;
  bool bVar3;
  QWidget *parent;
  QWidget *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  parent = in_RDI;
  this_00 = d_func((QMdiSubWindow *)0x63382f);
  bVar3 = false;
  if (in_RSI != 0) {
    bVar3 = ::operator==((QMenu **)in_RDI,(QPointer<QMenu> *)in_stack_ffffffffffffffa8);
  }
  if (bVar3 == false) {
    bVar3 = ::QPointer::operator_cast_to_bool((QPointer<QMenu> *)0x6338a6);
    if (bVar3) {
      in_stack_ffffffffffffffa8 = ::QPointer::operator_cast_to_QMenu_((QPointer<QMenu> *)0x6338bd);
      if (in_stack_ffffffffffffffa8 != (QMenu *)0x0) {
        (**(code **)(*(long *)&in_stack_ffffffffffffffa8->super_QWidget + 0x20))();
      }
      QPointer<QMenu>::operator=((QPointer<QMenu> *)in_RDI,in_stack_ffffffffffffffa8);
    }
    if (in_RSI != 0) {
      pQVar2 = (QWidget *)QObject::parent((QObject *)0x6338fa);
      if (pQVar2 != in_RDI) {
        QWidget::setParent(in_stack_ffffffffffffffd0,parent);
      }
      QPointer<QMenu>::operator=((QPointer<QMenu> *)in_RDI,in_stack_ffffffffffffffa8);
    }
  }
  else {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)this_00,(char *)CONCAT17(bVar3,in_stack_ffffffffffffffb8),
               (int)((ulong)in_RDI >> 0x20),(char *)in_stack_ffffffffffffffa8);
    QMessageLogger::warning
              (&stack0xffffffffffffffd0,"QMdiSubWindow::setSystemMenu: system menu is already set");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindow::setSystemMenu(QMenu *systemMenu)
{
    Q_D(QMdiSubWindow);
    if (Q_UNLIKELY(systemMenu && systemMenu == d->systemMenu)) {
        qWarning("QMdiSubWindow::setSystemMenu: system menu is already set");
        return;
    }

    if (d->systemMenu) {
        delete d->systemMenu;
        d->systemMenu = nullptr;
    }

    if (!systemMenu)
        return;

    if (systemMenu->parent() != this)
        systemMenu->setParent(this);
    d->systemMenu = systemMenu;
}